

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O2

xml_string * xml_parse_tag_end(xml_parser *parser)

{
  size_t sVar1;
  ulong uVar2;
  byte bVar3;
  uint8_t uVar4;
  ushort **ppuVar5;
  size_t sVar6;
  xml_string *pxVar7;
  size_t sVar8;
  ulong uVar9;
  
  sVar1 = parser->position;
  uVar2 = parser->length;
  uVar9 = sVar1;
  for (sVar8 = 0; sVar1 + sVar8 < uVar2; sVar8 = sVar8 + 1) {
    bVar3 = xml_parser_peek(parser,0);
    if (bVar3 == 0x3e) break;
    ppuVar5 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar5 + (ulong)bVar3 * 2 + 1) & 0x20) != 0) break;
    uVar9 = uVar9 + 1;
    if (uVar2 <= uVar9) {
      uVar9 = uVar2 - 1;
    }
    parser->position = uVar9;
  }
  uVar4 = xml_parser_peek(parser,0);
  if (uVar4 == '>') {
    sVar6 = uVar2 - 1;
    if (uVar9 + 1 < uVar2) {
      sVar6 = uVar9 + 1;
    }
    parser->position = sVar6;
    pxVar7 = (xml_string *)malloc(0x10);
    pxVar7->buffer = parser->buffer + sVar1;
    pxVar7->length = sVar8;
  }
  else {
    pxVar7 = (xml_string *)0x0;
    xml_parser_error(parser,CURRENT_CHARACTER,"xml_parse_tag_end::expected tag end");
  }
  return pxVar7;
}

Assistant:

static struct xml_string* xml_parse_tag_end(struct xml_parser* parser) {
	xml_parser_info(parser, "tag_end");
	size_t start = parser->position;
	size_t length = 0;

	/* Parse until `>' or a whitespace is reached
	 */
	while (start + length < parser->length) {
		uint8_t current = xml_parser_peek(parser, CURRENT_CHARACTER);

		if (('>' == current) || isspace(current)) {
			break;
		} else {
			xml_parser_consume(parser, 1);
			length++;
		}
	}

	/* Consume `>'
	 */
	if ('>' != xml_parser_peek(parser, CURRENT_CHARACTER)) {
		xml_parser_error(parser, CURRENT_CHARACTER, "xml_parse_tag_end::expected tag end");
		return 0;
	}
	xml_parser_consume(parser, 1);

	/* Return parsed tag name
	 */
	struct xml_string* name = malloc(sizeof(struct xml_string));
	name->buffer = &parser->buffer[start];
	name->length = length;
	return name;
}